

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::RleBpEncoder::WriteValue(RleBpEncoder *this,WriteStream *writer,uint32_t *value)

{
  int iVar1;
  long lVar2;
  int *in_RDX;
  WriteStream *in_RDI;
  idx_t i;
  RleBpEncoder *in_stack_ffffffffffffffe0;
  ulong uVar3;
  
  if (*(long *)(in_RDI + 0x818) == 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      *(int *)(in_RDI + 8) = *in_RDX;
      *(undefined8 *)(in_RDI + 0x10) = 1;
    }
    else if (*(int *)(in_RDI + 8) == *in_RDX) {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
    else if (*(ulong *)(in_RDI + 0x10) < 4) {
      for (uVar3 = 0; uVar3 < *(ulong *)(in_RDI + 0x10); uVar3 = uVar3 + 1) {
        lVar2 = *(long *)(in_RDI + 0x818);
        *(long *)(in_RDI + 0x818) = lVar2 + 1;
        *(undefined4 *)(in_RDI + lVar2 * 4 + 0x18) = *(undefined4 *)(in_RDI + 8);
      }
      iVar1 = *in_RDX;
      lVar2 = *(long *)(in_RDI + 0x818);
      *(long *)(in_RDI + 0x818) = lVar2 + 1;
      *(int *)(in_RDI + lVar2 * 4 + 0x18) = iVar1;
      *(undefined8 *)(in_RDI + 0x10) = 0;
    }
    else {
      WriteRun(in_stack_ffffffffffffffe0,in_RDI);
      *(int *)(in_RDI + 8) = *in_RDX;
      *(undefined8 *)(in_RDI + 0x10) = 1;
    }
  }
  else {
    iVar1 = *in_RDX;
    lVar2 = *(long *)(in_RDI + 0x818);
    *(long *)(in_RDI + 0x818) = lVar2 + 1;
    *(int *)(in_RDI + lVar2 * 4 + 0x18) = iVar1;
    if (*(long *)(in_RDI + 0x818) == 0x100) {
      WriteRun(in_stack_ffffffffffffffe0,in_RDI);
    }
  }
  return;
}

Assistant:

void WriteValue(WriteStream &writer, const uint32_t &value) {
		if (bp_block_count != 0) {
			// We already committed to a BP run
			D_ASSERT(rle_count == 0);
			bp_block[bp_block_count++] = value;
			if (bp_block_count == BP_BLOCK_SIZE) {
				WriteRun(writer);
			}
			return;
		}

		if (rle_count == 0) {
			// Starting fresh, try for an RLE run first
			rle_value = value;
			rle_count = 1;
			return;
		}

		// We're trying for an RLE run
		if (rle_value == value) {
			// Same as current RLE value
			rle_count++;
			return;
		}

		// Value differs from current RLE value
		if (rle_count >= MINIMUM_RLE_COUNT) {
			// We have enough values for an RLE run
			WriteRun(writer);
			rle_value = value;
			rle_count = 1;
			return;
		}

		// Not enough values, convert and commit to a BP run
		D_ASSERT(bp_block_count == 0);
		for (idx_t i = 0; i < rle_count; i++) {
			bp_block[bp_block_count++] = rle_value;
		}
		bp_block[bp_block_count++] = value;
		rle_count = 0;
	}